

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.cpp
# Opt level: O1

bool __thiscall Replay::skip_until_nmi(Replay *this,uint32_t target_skip_nmi)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  char *__s;
  long lVar5;
  BigFile f;
  TraceSkip msg;
  TraceCacheHeader header;
  BigFile local_98;
  uint local_88;
  uint64_t local_84;
  uint64_t local_7c;
  undefined2 local_74;
  undefined2 local_72;
  uint16_t local_70;
  uint16_t local_6e;
  uint16_t local_6c;
  uint16_t local_6a;
  uint16_t local_68;
  uint16_t local_66;
  undefined1 local_64;
  undefined1 local_63;
  uint8_t local_62;
  char *local_60;
  int local_58;
  char local_50 [4];
  uint local_4c;
  uint local_48;
  long local_3c;
  
  local_98._offset = 0;
  local_98._file = (FILE *)0x0;
  pcVar1 = (this->_trace_file_name)._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->_trace_file_name)._M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  local_98._file = (FILE *)fopen(local_60,"rb");
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if ((FILE *)local_98._file == (FILE *)0x0) goto LAB_00138dc1;
  local_60 = (char *)0x534e535443414348;
  sVar4 = fread(&local_60,1,0x2c,(FILE *)local_98._file);
  local_98._offset = local_98._offset + sVar4;
  snestistics::BigFile::validate(&local_98);
  if (local_58 == 4) {
    if (target_skip_nmi < local_48) {
      __s = "Emulation cache does not have enough NMIs, not using";
      goto LAB_00138db2;
    }
    uVar2 = (ulong)target_skip_nmi / (ulong)local_4c;
    snestistics::BigFile::set_offset(&local_98,uVar2 * 0x20027 + local_3c);
    sVar4 = fread(&local_88,1,0x27,(FILE *)local_98._file);
    local_98._offset = local_98._offset + sVar4;
    snestistics::BigFile::validate(&local_98);
    if (target_skip_nmi < local_88) {
      __assert_fail("msg.nmi <= target_skip_nmi",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/replay.cpp"
                    ,0xa8,"bool Replay::skip_until_nmi(const uint32_t)");
    }
    (this->regs)._A = local_6e;
    (this->regs)._X = local_68;
    (this->regs)._Y = local_66;
    (this->regs)._S = local_6a;
    (this->regs)._DB = local_62;
    (this->regs)._DP = local_6c;
    (this->regs)._PC = (uint)CONCAT12(local_64,local_74);
    (this->regs)._P = local_70;
    (this->regs)._WRAM = (uint)CONCAT12(local_63,local_72);
    lVar5 = 0;
    do {
      memset((this->regs)._memory + lVar5,0,0x8000);
      lVar5 = lVar5 + 0x10000;
    } while (lVar5 != 0x1000000);
    sVar4 = fread((this->regs)._memory + 0x7e0000,1,0x10000,(FILE *)local_98._file);
    local_98._offset = local_98._offset + sVar4;
    snestistics::BigFile::validate(&local_98);
    sVar4 = fread((this->regs)._memory + 0x7f0000,1,0x10000,(FILE *)local_98._file);
    local_98._offset = local_98._offset + sVar4;
    snestistics::BigFile::validate(&local_98);
    if (uVar2 * local_4c - (ulong)local_88 != 0) {
      __assert_fail("msg.nmi == skip * nmi_per_skip",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/replay.cpp"
                    ,0xbb,"bool Replay::skip_until_nmi(const uint32_t)");
    }
    this->_current_nmi = local_88;
    snestistics::BigFile::set_offset(&this->_trace_file,local_84);
    this->_current_op = local_7c;
    this->_accumulated_op_counter = local_7c - 1;
    read_next_event(this);
    if ((this->_trace_helper)._file != (FILE *)0x0) {
      snestistics::BigFile::set_offset(&this->_trace_helper,this->_current_op * 0x2f);
    }
  }
  else {
    __s = "Emulation cache has wrong version, not using";
LAB_00138db2:
    puts(__s);
  }
  fclose((FILE *)local_98._file);
LAB_00138dc1:
  if (target_skip_nmi < this->_current_nmi) {
    __assert_fail("_current_nmi <= target_skip_nmi",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/replay.cpp"
                  ,0xce,"bool Replay::skip_until_nmi(const uint32_t)");
  }
  bVar3 = true;
  if (this->_current_nmi != target_skip_nmi) {
    do {
      if (((this->_current_nmi == target_skip_nmi) && (this->_current_op == this->_next_event_op))
         && ((this->_next_event).type == EVENT_NMI)) {
        return true;
      }
      bVar3 = next(this);
    } while (bVar3);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Replay::skip_until_nmi(const uint32_t target_skip_nmi) {

	EmulateRegisters &regs = this->regs;

	// TODO: If we are running without skip-cache we can't go back! Fix, or require skip cache...

	// Use skip file if it exists!
	// Note: Currently we can only skip to the point right AFTER an NMI so we do one nmi too little here
	// Using do/while here is a bit bananas but helps with indentation :)
	do {
		BigFile f;
		{
			std::string filename = _trace_file_name + ".emulation_cache";
			f._file = fopen(filename.c_str(), "rb"); // The 0 here must be wrong if we do many
		}
		if (!f._file)
			break;

		snestistics::TraceCacheHeader header;
		f.read(&header, sizeof(header));

		// TODO: Test again trace hash as well for sanity?

		if (header.version != TRACE_CACHE_VERSION) {
			printf("Emulation cache has wrong version, not using\n");
			fclose(f._file);
			break;
		}

		if(target_skip_nmi < header.num_nmis) {
			printf("Emulation cache does not have enough NMIs, not using\n");
			fclose(f._file);
			break;
		}

		const uint32_t nmi_per_skip = header.nmi_per_skip;

		// Since skip information is to get AFTER an nmi just happened, we skip to the frame before
		// We use emulation to get to the before NMI case
		uint64_t skip = (target_skip_nmi) / nmi_per_skip;
		f.set_offset(skip * snestistics::trace_skip_total_size + header.replay_cache_seek_offset);

		snestistics::TraceSkip msg;
		f.read(&msg, sizeof(msg));
		assert(msg.nmi <= target_skip_nmi);

		// TODO: Don't leak STATE implementation like this
		regs._A  = msg.regs.A;
		regs._X  = msg.regs.X;
		regs._Y  = msg.regs.Y;
		regs._S  = msg.regs.S;
		regs._DB = msg.regs.DB;
		regs._DP = msg.regs.DP;
		regs._PC = (msg.regs.pc_bank<<16)|msg.regs.pc_address;
		regs._P  = msg.regs.P;
		regs._WRAM = (msg.regs.wram_bank<<16)|msg.regs.wram_address;

		for (int bank=0; bank<256; bank++)
			memset(&regs._memory[bank*64*1024], 0, 0x8000);

		f.read(&regs._memory[0x7E0000], 1024*64);
		f.read(&regs._memory[0x7F0000], 1024*64);

		assert(msg.nmi == skip * nmi_per_skip);

		_current_nmi = msg.nmi;
		_trace_file.set_offset(msg.seek_offset_trace_file);

		_current_op = msg.current_op;
		_accumulated_op_counter = msg.current_op-1;

		read_next_event();

		#ifdef VERIFY_OPS
			if (_trace_helper._file) {
				uint64_t helper_pos = _current_op * (sizeof(snestistics::HelperType)+sizeof(snestistics::HelperOp));
				_trace_helper.set_offset(helper_pos);
			}
		#endif
		fclose(f._file);
	} while (false);

	CUSTOM_ASSERT(_current_nmi <= target_skip_nmi);

	if (_current_nmi == target_skip_nmi) // We had a skip for the exact right nmi
		return true;

	// TODO: We might have to re-emulate from start if there was no skip and we want to go to same frame or less
	// Skips are not for every nmi so make sure we reach the right one
	while (true) {
		if (target_skip_nmi == _current_nmi && _current_op == _next_event_op && _next_event.type == TraceEventType::EVENT_NMI)
			return true;
		if (!next())
			return false;
	}
}